

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall
tetgenmesh::facenormal(tetgenmesh *this,point pa,point pb,point pc,double *n,int pivot,double *lav)

{
  double dVar1;
  undefined1 auVar2 [16];
  double *v2;
  double *v1;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  double local_18;
  
  v2 = &local_68;
  local_48 = *pb - *pa;
  local_68 = *pa - *pc;
  dStack_40 = pb[1] - pa[1];
  dStack_60 = pa[1] - pc[1];
  local_38 = pb[2] - pa[2];
  local_58 = pa[2] - pc[2];
  if (pivot < 1) {
    v1 = &local_48;
  }
  else {
    local_28 = *pc - *pb;
    auVar3._8_8_ = pc[1] - pb[1];
    local_18 = pc[2] - pb[2];
    dVar4 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
    dVar5 = local_58 * local_58 + local_68 * local_68 + dStack_60 * dStack_60;
    auVar3._0_8_ = local_28 * local_28 + auVar3._8_8_ * auVar3._8_8_;
    v1 = &local_28;
    v2 = &local_48;
    if (dVar5 <= dVar4) {
      v1 = &local_68;
      v2 = &local_28;
    }
    dVar1 = local_18 * local_18 + auVar3._0_8_;
    dVar6 = dVar5;
    if (dVar5 <= dVar4) {
      dVar6 = dVar4;
    }
    if (dVar6 < dVar1) {
      v1 = &local_48;
      v2 = &local_68;
    }
    dStack_20 = auVar3._8_8_;
    if (lav != (double *)0x0) {
      auVar2._8_8_ = dVar5;
      auVar2._0_8_ = dVar4;
      auVar3 = sqrtpd(auVar3,auVar2);
      *lav = (SQRT(dVar1) + auVar3._8_8_ + auVar3._0_8_) / 3.0;
    }
  }
  cross(this,v1,v2,n);
  *(undefined4 *)n = *(undefined4 *)n;
  *(uint *)((long)n + 4) = *(uint *)((long)n + 4) ^ 0x80000000;
  *(undefined4 *)(n + 1) = *(undefined4 *)(n + 1);
  *(uint *)((long)n + 0xc) = *(uint *)((long)n + 0xc) ^ 0x80000000;
  n[2] = -n[2];
  return;
}

Assistant:

void tetgenmesh::facenormal(point pa, point pb, point pc, REAL *n, int pivot,
                            REAL* lav)
{
  REAL v1[3], v2[3], v3[3], *pv1, *pv2;
  REAL L1, L2, L3;

  v1[0] = pb[0] - pa[0];  // edge vector v1: a->b
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  v2[0] = pa[0] - pc[0];  // edge vector v2: c->a
  v2[1] = pa[1] - pc[1];
  v2[2] = pa[2] - pc[2];

  // Default, normal is calculated by: v1 x (-v2) (see Fig. fnormal).
  if (pivot > 0) {
    // Choose edge vectors by Burdakov's algorithm.
    v3[0] = pc[0] - pb[0];  // edge vector v3: b->c
    v3[1] = pc[1] - pb[1];
    v3[2] = pc[2] - pb[2];
    L1 = dot(v1, v1);
    L2 = dot(v2, v2);
    L3 = dot(v3, v3);
    // Sort the three edge lengths.
    if (L1 < L2) {
      if (L2 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v3; pv2 = v1; // n = v3 x (-v1).
      }
    } else {
      if (L1 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v2; pv2 = v3; // n = v2 x (-v3).
      }
    }
    if (lav) {
      // return the average edge length.
      *lav = (sqrt(L1) + sqrt(L2) + sqrt(L3)) / 3.0;
    }
  } else {
    pv1 = v1; pv2 = v2; // n = v1 x (-v2).
  }

  // Calculate the face normal.
  cross(pv1, pv2, n);
  // Inverse the direction;
  n[0] = -n[0];
  n[1] = -n[1];
  n[2] = -n[2];
}